

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O1

void __thiscall
amrex::DistributionMapping::LeastUsedCPUs
          (DistributionMapping *this,int nprocs,Vector<int,_std::allocator<int>_> *result)

{
  pointer piVar1;
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  std::vector<int,_std::allocator<int>_>::resize
            (&result->super_vector<int,_std::allocator<int>_>,(long)nprocs);
  auVar2 = _DAT_006979c0;
  if (0 < nprocs) {
    piVar1 = (result->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (ulong)(uint)nprocs - 1;
    auVar5._8_4_ = (int)lVar3;
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = (int)((ulong)lVar3 >> 0x20);
    uVar4 = 0;
    auVar5 = auVar5 ^ _DAT_006979c0;
    auVar6 = _DAT_006979b0;
    do {
      auVar7 = auVar6 ^ auVar2;
      if ((bool)(~(auVar7._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar7._0_4_ ||
                  auVar5._4_4_ < auVar7._4_4_) & 1)) {
        piVar1[uVar4] = (int)uVar4;
      }
      if ((auVar7._12_4_ != auVar5._12_4_ || auVar7._8_4_ <= auVar5._8_4_) &&
          auVar7._12_4_ <= auVar5._12_4_) {
        piVar1[uVar4 + 1] = (int)uVar4 + 1;
      }
      uVar4 = uVar4 + 2;
      lVar3 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar3 + 2;
    } while ((nprocs + 1U & 0xfffffffe) != uVar4);
  }
  return;
}

Assistant:

void
DistributionMapping::LeastUsedCPUs (int         nprocs,
                                    Vector<int>& result)
{
    result.resize(nprocs);

#ifdef BL_USE_MPI
    BL_PROFILE("DistributionMapping::LeastUsedCPUs()");

    AMREX_ASSERT(nprocs <= ParallelContext::NProcsSub());

    Vector<Long> bytes(ParallelContext::NProcsSub());
    Long thisbyte = amrex::TotalBytesAllocatedInFabs()/1024;
    ParallelAllGather::AllGather(thisbyte, bytes.dataPtr(), ParallelContext::CommunicatorSub());

    std::vector<LIpair> LIpairV;

    LIpairV.reserve(nprocs);

    for (int i(0); i < nprocs; ++i)
    {
        LIpairV.push_back(LIpair(bytes[i],i));
    }

    bytes.clear();

    Sort(LIpairV, false);

    for (int i(0); i < nprocs; ++i)
    {
        result[i] = LIpairV[i].second;
    }

    if (flag_verbose_mapper) {
        Print() << "LeastUsedCPUs:" << std::endl;
        for (const auto &p : LIpairV) {
            Print() << "  Rank " << p.second << " contains " << p.first << std::endl;
        }
    }
#else
    for (int i(0); i < nprocs; ++i)
    {
        result[i] = i;
    }
#endif
}